

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWriteBlifMv.c
# Opt level: O2

void Io_WriteBlifMv(Abc_Ntk_t *pNtk,char *FileName)

{
  uint __line;
  FILE *__stream;
  char *pcVar1;
  Abc_Des_t *pAVar2;
  Abc_Ntk_t *pNtk_00;
  int i;
  char *pcVar3;
  
  if (pNtk->ntkType == ABC_NTK_NETLIST) {
    if (pNtk->ntkFunc == ABC_FUNC_BLIFMV) {
      __stream = fopen(FileName,"w");
      if (__stream == (FILE *)0x0) {
        fwrite("Io_WriteBlifMv(): Cannot open the output file.\n",0x2f,1,_stdout);
        return;
      }
      pcVar3 = pNtk->pName;
      i = 0;
      pcVar1 = Extra_TimeStamp();
      fprintf(__stream,"# Benchmark \"%s\" written by ABC on %s\n",pcVar3,pcVar1);
      Io_NtkWriteBlifMv((FILE *)__stream,pNtk);
      pAVar2 = pNtk->pDesign;
      if (pAVar2 != (Abc_Des_t *)0x0) {
        for (; i < pAVar2->vModules->nSize; i = i + 1) {
          pNtk_00 = (Abc_Ntk_t *)Vec_PtrEntry(pAVar2->vModules,i);
          if (pNtk_00 != pNtk) {
            fwrite("\n\n",2,1,__stream);
            Io_NtkWriteBlifMv((FILE *)__stream,pNtk_00);
          }
          pAVar2 = pNtk->pDesign;
        }
      }
      fclose(__stream);
      return;
    }
    pcVar3 = "Abc_NtkHasBlifMv(pNtk)";
    __line = 0x40;
  }
  else {
    pcVar3 = "Abc_NtkIsNetlist(pNtk)";
    __line = 0x3f;
  }
  __assert_fail(pcVar3,
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioWriteBlifMv.c"
                ,__line,"void Io_WriteBlifMv(Abc_Ntk_t *, char *)");
}

Assistant:

void Io_WriteBlifMv( Abc_Ntk_t * pNtk, char * FileName )
{
    FILE * pFile;
    Abc_Ntk_t * pNtkTemp;
    int i;
    assert( Abc_NtkIsNetlist(pNtk) );
    assert( Abc_NtkHasBlifMv(pNtk) );
    // start writing the file
    pFile = fopen( FileName, "w" );
    if ( pFile == NULL )
    {
        fprintf( stdout, "Io_WriteBlifMv(): Cannot open the output file.\n" );
        return;
    }
    fprintf( pFile, "# Benchmark \"%s\" written by ABC on %s\n", pNtk->pName, Extra_TimeStamp() );
    // write the master network
    Io_NtkWriteBlifMv( pFile, pNtk );
    // write the remaining networks
    if ( pNtk->pDesign )
    {
        Vec_PtrForEachEntry( Abc_Ntk_t *, pNtk->pDesign->vModules, pNtkTemp, i )
        {
            if ( pNtkTemp == pNtk )
                continue;
            fprintf( pFile, "\n\n" );
            Io_NtkWriteBlifMv( pFile, pNtkTemp );
        }
    }
    fclose( pFile );
}